

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O0

void __thiscall
ptc::Print<char32_t>::
print_backend<std::__cxx11::basic_ostringstream<char32_t,std::char_traits<char32_t>,std::allocator<char32_t>>&,char_const(&)[8],char_const(&)[5]>
          (Print<char32_t> *this,
          basic_ostringstream<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *os,
          char (*first) [8],char (*args) [5])

{
  bool bVar1;
  basic_ostream<char32_t,_std::char_traits<char32_t>_> *pbVar2;
  bool local_c2;
  bool local_61;
  ANSI local_50 [7];
  ANSI local_34;
  lock_guard<std::mutex> local_30;
  lock_guard<std::mutex> lock;
  char (*args_local) [5];
  char (*first_local) [8];
  basic_ostringstream<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *os_local;
  Print<char32_t> *this_local;
  
  lock._M_device = (mutex_type *)args;
  std::lock_guard<std::mutex>::lock_guard(&local_30,(mutex_type *)mutex_);
  local_34 = first;
  bVar1 = is_escape<char[8]>(first,&local_34);
  local_61 = true;
  if (!bVar1) {
    local_61 = std::__cxx11::
               basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::empty
                         (&this->pattern);
  }
  if (local_61 == false) {
    pbVar2 = std::operator<<(&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,
                             &this->pattern);
    pbVar2 = std::operator<<(pbVar2,*first);
    std::operator<<(pbVar2,&this->pattern);
  }
  else {
    std::operator<<(&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,*first);
  }
  local_50[2] = 0;
  bVar1 = is_escape<char[8]>(first,local_50 + 2);
  if (bVar1) {
    bVar1 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::empty
                      (&this->pattern);
    if (bVar1) {
      pbVar2 = std::operator<<(&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,
                               (char *)lock._M_device);
      std::operator<<(pbVar2,&this->sep);
    }
    else {
      pbVar2 = std::operator<<(&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,
                               &this->pattern);
      pbVar2 = std::operator<<(pbVar2,(char *)lock._M_device);
      pbVar2 = std::operator<<(pbVar2,&this->pattern);
      std::operator<<(pbVar2,&this->sep);
    }
  }
  else {
    bVar1 = std::__cxx11::
            basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::empty
                      (&this->pattern);
    if (bVar1) {
      pbVar2 = std::operator<<(&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,
                               &this->sep);
      std::operator<<(pbVar2,(char *)lock._M_device);
    }
    else {
      pbVar2 = std::operator<<(&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,
                               &this->sep);
      pbVar2 = std::operator<<(pbVar2,&this->pattern);
      pbVar2 = std::operator<<(pbVar2,(char *)lock._M_device);
      std::operator<<(pbVar2,&this->pattern);
    }
  }
  std::operator<<(&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,&this->end);
  local_50[1] = 1;
  bVar1 = is_escape<char[8]>(first,local_50 + 1);
  local_c2 = true;
  if (!bVar1) {
    local_50[0] = generic;
    local_c2 = is_escape<char[5]>((char (*) [5])lock._M_device,local_50);
  }
  if (local_c2 != false) {
    std::operator<<(&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,"\x1b[0m");
  }
  if ((this->flush & 1U) != 0) {
    std::basic_ostream<char32_t,_std::char_traits<char32_t>_>::operator<<
              (&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,
               std::flush<char32_t,std::char_traits<char32_t>>);
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_30);
  return;
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }